

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O0

bool __thiscall XmlRpc::XmlRpcValue::intFromXml(XmlRpcValue *this,string *valueXml,int *offset)

{
  long lVar1;
  int *in_RDX;
  undefined4 *in_RDI;
  long ivalue;
  char *valueEnd;
  char *valueStart;
  char *local_30;
  char *local_28;
  int *local_20;
  
  local_20 = in_RDX;
  lVar1 = std::__cxx11::string::c_str();
  local_28 = (char *)(lVar1 + *local_20);
  lVar1 = strtol(local_28,&local_30,10);
  if (local_30 != local_28) {
    *in_RDI = 2;
    in_RDI[2] = (int)lVar1;
    *local_20 = ((int)local_30 - (int)local_28) + *local_20;
  }
  return local_30 != local_28;
}

Assistant:

bool XmlRpcValue::intFromXml(std::string const& valueXml, int* offset)
  {
    const char* valueStart = valueXml.c_str() + *offset;
    char* valueEnd;
    long ivalue = strtol(valueStart, &valueEnd, 10);
    if (valueEnd == valueStart)
      return false;

    _type = TypeInt;
    _value.asInt = int(ivalue);
    *offset += int(valueEnd - valueStart);
    return true;
  }